

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::
     ParseArg<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,pstd::span<float>>
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *iter,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      end,string *name,span<float> out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  span<float> ptr;
  span<float> out_00;
  span<float> out_01;
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  bool bVar4;
  reference pbVar5;
  string *prefix;
  string *in_RCX;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  float *in_R8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R9;
  string value;
  string arg;
  undefined4 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe18;
  string local_1d8 [32];
  string *in_stack_fffffffffffffe48;
  float *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  string local_1a0 [32];
  string local_180 [36];
  undefined4 local_15c;
  string local_158 [32];
  string *local_138;
  float *pfStack_130;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_28;
  string *local_20;
  float *pfStack_18;
  byte local_1;
  
  local_28 = in_RDI;
  local_20 = in_RCX;
  pfStack_18 = in_R8;
  pbVar5 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(in_RDI);
  __args = &local_58;
  std::__cxx11::string::string((string *)__args,(string *)pbVar5);
  prefix = (string *)std::__cxx11::string::operator[]((ulong)__args);
  if (prefix->_M_dataplus == (_Alloc_hider)0x2d) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,local_88);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__cxx11::string::substr((ulong)local_a8,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  normalizeArg(in_stack_fffffffffffffe18);
  std::operator+(in_stack_fffffffffffffdf8,(char)((ulong)prefix >> 0x38));
  normalizeArg(in_stack_fffffffffffffe18);
  bVar1 = matchPrefix(in_stack_fffffffffffffdf8,prefix);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c8);
  if ((bVar1 & 1) == 0) {
    normalizeArg(in_stack_fffffffffffffe18);
    normalizeArg(in_stack_fffffffffffffe18);
    bVar2 = std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_180);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
      local_15c = 1;
    }
    else {
      ptr.n = (size_t)pfStack_18;
      ptr.ptr = (float *)local_20;
      uVar3 = enable<pstd::span<float>>(ptr);
      if ((bool)uVar3) {
        local_1 = 1;
        local_15c = 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(local_28);
        bVar4 = __gnu_cxx::operator==
                          (in_R9,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdde,
                                                            CONCAT15(bVar2,CONCAT14(uVar3,
                                                  in_stack_fffffffffffffdd8)))));
        if (bVar4) {
          StringPrintf<std::__cxx11::string&>(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          std::
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)prefix,__args);
          std::__cxx11::string::~string(local_1d8);
          local_1 = 0;
          local_15c = 1;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(local_28);
          out_01.n = in_stack_fffffffffffffe58;
          out_01.ptr = pfStack_18;
          bVar4 = initArg(local_20,out_01);
          if (bVar4) {
            local_1 = 1;
            local_15c = 1;
          }
          else {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(local_28);
            StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8
                      );
            std::
            function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)prefix,__args);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
            local_1 = 0;
            local_15c = 1;
          }
        }
      }
    }
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_128,(ulong)&local_58);
    local_138 = local_20;
    pfStack_130 = pfStack_18;
    out_00.n = in_stack_fffffffffffffe58;
    out_00.ptr = in_stack_fffffffffffffe50;
    local_1 = initArg(in_stack_fffffffffffffe48,out_00);
    if (!(bool)local_1) {
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)prefix,__args);
      std::__cxx11::string::~string(local_158);
    }
    local_15c = 1;
    std::__cxx11::string::~string(local_128);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseArg(Iter *iter, Iter end, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **iter;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for --%s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        if (enable(out))
            return true;

        ++(*iter);
        if (*iter == end) {
            onError(StringPrintf("missing value after --%s argument", arg));
            return false;
        }
        if (!initArg(**iter, out)) {
            onError(StringPrintf("invalid value \"%s\" for --%s argument", **iter, name));
            return false;
        }
        return true;
    } else
        return false;
}